

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_server.h
# Opt level: O0

void __thiscall
rest_rpc::rpc_service::rpc_server::publish_by_token<person>
          (rpc_server *this,string *key,string *token,person *data)

{
  person *in_RDX;
  string *in_RSI;
  person *in_stack_ffffffffffffff28;
  string local_60 [32];
  string local_40 [64];
  
  std::__cxx11::string::string(local_40,in_RSI);
  std::__cxx11::string::string(local_60,(string *)in_RDX);
  person::person(in_RDX,in_stack_ffffffffffffff28);
  publish<person>(this,key,token,data);
  person::~person((person *)0x20ea65);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void publish_by_token(const std::string &key, std::string token, T data) {
    publish(key, std::move(token), std::move(data));
  }